

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O3

void __thiscall
wallet::wallet_tests::scan_for_wallet_transactions::test_method(scan_for_wallet_transactions *this)

{
  undefined1 auVar1 [16];
  pointer ppCVar2;
  Chain *pCVar3;
  pointer ppCVar4;
  uint256 *puVar5;
  ChainstateManager *pCVar6;
  MockableData records;
  MockableData records_00;
  MockableData records_01;
  MockableData records_02;
  void *pvVar7;
  undefined1 auVar8 [16];
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> uVar9;
  bool bVar10;
  readonly_property65 rVar11;
  Chainstate *pCVar12;
  CBlockFileInfo *pCVar13;
  uchar *puVar14;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar15;
  anon_enum_32 aVar16;
  iterator pvVar17;
  char *pcVar18;
  WalletRescanReserver *pWVar19;
  iterator pvVar20;
  CBlockIndex *pCVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  initializer_list<int> __l;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  initializer_list<int> __l_00;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  check_type cVar34;
  undefined8 in_stack_fffffffffffff3f8;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar30;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CBlockIndex *pCVar31;
  undefined8 in_stack_fffffffffffff410;
  CBlockIndex *pCVar32;
  CKey *this_00;
  size_t in_stack_fffffffffffff420;
  int *piVar33;
  undefined1 *local_bd8;
  undefined1 *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  undefined1 *local_ba8;
  undefined1 *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  char *local_b68;
  char *local_b60;
  undefined1 *local_b58;
  undefined1 *local_b50;
  char *local_b48;
  char *local_b40;
  undefined1 *local_b38;
  undefined1 *local_b30;
  char *local_b28;
  char *local_b20;
  long *local_b18;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  undefined1 *local_af0;
  undefined1 *local_ae8;
  char *local_ae0;
  char *local_ad8;
  undefined1 *local_ad0;
  undefined1 *local_ac8;
  char *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  undefined1 *local_a90;
  undefined1 *local_a88;
  char *local_a80;
  char *local_a78;
  long *local_a70;
  char *local_a68;
  char *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  char *local_a18;
  char *local_a10;
  assertion_result local_a08;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  char *local_900;
  char *local_8f8;
  _Any_data local_8f0;
  code *local_8e0;
  code *local_8d8;
  time_point fake_time;
  element_type *local_8c8;
  shared_count local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  long *local_7f0;
  undefined1 local_7e8 [8];
  assertion_result local_7e0;
  char *local_7c8;
  uint256 *local_7c0;
  CBlockLocator locator_1;
  ScanResult *local_790;
  char *local_788;
  assertion_result local_780;
  WalletRescanReserver reserver;
  undefined1 local_738 [16];
  _Base_ptr local_728;
  _Base_ptr local_720;
  _Base_ptr local_718;
  size_t local_710;
  undefined1 local_708 [16];
  _Base_ptr local_6f8;
  _Base_ptr local_6f0;
  _Base_ptr local_6e8;
  size_t local_6e0;
  undefined1 local_6d8 [16];
  _Base_ptr local_6c8;
  _Base_ptr local_6c0;
  _Base_ptr local_6b8;
  size_t local_6b0;
  CBlockLocator locator;
  assertion_result *paStack_690;
  undefined1 local_678 [8];
  bool bStack_670;
  uchar uStack_66f;
  uchar uStack_66e;
  uchar uStack_66d;
  uchar uStack_66c;
  uchar uStack_66b;
  uchar uStack_66a;
  uchar uStack_669;
  shared_count sStack_668;
  char *pcStack_660;
  ScanResult result;
  uchar local_60c [4];
  undefined1 local_608 [16];
  _Base_ptr local_5f8;
  _Base_ptr local_5f0;
  _Base_ptr local_5e8;
  size_t local_5e0;
  CWallet wallet;
  CBlock local_128 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar30 = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x4e,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x4e,"operator()","m_node.chainman");
  wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
  wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&wallet);
  pCVar12 = ChainstateManager::ActiveChainstate
                      ((puVar30->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar12->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar12->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar21 = (CBlockIndex *)0x0;
  }
  else {
    pCVar21 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&wallet)
  ;
  wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
  wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&wallet);
  pCVar13 = ::node::BlockManager::GetBlockFileInfo
                      (&((puVar30->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                        m_blockman,
                       (long)(int)(-(uint)((pCVar21->nStatus & 8) == 0) | pCVar21->nFile));
  pCVar13->nSize = 0x8000000;
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&wallet)
  ;
  reserver.m_wallet = (CWallet *)0x0;
  reserver.m_could_reserve = false;
  reserver._9_7_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = reserver.m_now.super__Function_base._M_functor._8_8_;
  reserver.m_now.super__Function_base._M_functor = (_Any_data)(auVar1 << 0x40);
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  CKey::GetPubKey((CPubKey *)&wallet,this_00);
  GetScriptForRawPubKey((CScript *)&result,(CPubKey *)&wallet);
  TestChain100Setup::CreateAndProcessBlock
            (local_128,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&reserver,
             (CScript *)&result,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_128[0].vtx);
  if (0x1c < (uint)result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._24_4_) {
    free((void *)result._0_8_);
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&reserver);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x51,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x51,"operator()","m_node.chainman");
  wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
  wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&wallet);
  pCVar12 = ChainstateManager::ActiveChainstate
                      ((puVar30->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar12->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar12->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar31 = (CBlockIndex *)0x0;
  }
  else {
    pCVar31 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&wallet)
  ;
  pCVar3 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  result._0_8_ = result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"");
  local_5f0 = (_Base_ptr)(local_608 + 8);
  local_608 = (undefined1  [16])0x0;
  local_5f8 = (_Base_ptr)0x0;
  local_5e0 = 0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pCVar31;
  records._M_t._M_impl._0_8_ = in_stack_fffffffffffff3f8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)this;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff410;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this_00;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff420;
  local_5e8 = local_5f0;
  CreateMockableWalletDatabase((wallet *)&local_7f0,records);
  CWallet::CWallet(&wallet,pCVar3,(string *)&result,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_7f0);
  if (local_7f0 != (long *)0x0) {
    (**(code **)(*local_7f0 + 8))();
  }
  local_7f0 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
               *)local_608);
  if ((uchar *)result._0_8_ != result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc
     ) {
    operator_delete((void *)result._0_8_,
                    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ + 1);
  }
  result._0_8_ = &wallet.cs_wallet;
  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&result);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x58,"test_method","m_node.chainman");
  reserver._0_9_ = ZEXT89(0x139c540);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&reserver);
  CWallet::SetWalletFlag(&wallet,0x400000000);
  pCVar12 = ChainstateManager::ActiveChainstate
                      ((puVar30->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar12->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar4 = (pCVar12->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar12 = ChainstateManager::ActiveChainstate
                      ((puVar30->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar5 = (pCVar12->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->phashBlock;
  if (puVar5 != (uint256 *)0x0) {
    wallet.m_last_block_processed_height = (int)((ulong)((long)ppCVar2 - (long)ppCVar4) >> 3) + -1;
    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&reserver);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&result);
    AddKey(&wallet,this_00);
    pWVar19 = &reserver;
    reserver.m_could_reserve = false;
    reserver.m_wallet = &wallet;
    reserver.m_now.super__Function_base._M_functor = (_Any_data)0x0;
    reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
    reserver.m_now._M_invoker = (_Invoker_type)0x0;
    WalletRescanReserver::reserve(pWVar19,false);
    stack0xfffffffffffff968 = (undefined1  [16])0x0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pvVar17 = (iterator)0x0;
    CWallet::ScanForWalletTransactions
              (&result,&wallet,(uint256 *)&locator,0,(optional<int>)0x0,pWVar19,false,false);
    local_800 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_7f8 = "";
    local_810 = &boost::unit_test::basic_cstring<char_const>::null;
    local_808 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x60;
    file.m_begin = (iterator)&local_800;
    msg.m_end = (iterator)pWVar19;
    msg.m_begin = pvVar17;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_810,msg);
    local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
    local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
    local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_7c8 = "";
    local_7c0 = (uint256 *)local_7e8;
    local_678[0] = result.status == FAILURE;
    local_7e8._0_4_ = 1;
    bStack_670 = false;
    uStack_66f = '\0';
    uStack_66e = '\0';
    uStack_66d = '\0';
    uStack_66c = '\0';
    uStack_66b = '\0';
    uStack_66a = '\0';
    uStack_669 = '\0';
    sStack_668.pi_ = (sp_counted_base *)0x0;
    local_780._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_780.m_message.px = (element_type *)0xf64ae8;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01390248;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0x48;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._1_7_ = 0x13902;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar17 = (iterator)0x1;
    pvVar20 = (iterator)0x2;
    local_790 = &result;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf64b06,
               (size_t)&local_780,0x60,(uint256 *)&locator,"CWallet::ScanResult::FAILURE",&locator_1
              );
    boost::detail::shared_count::~shared_count(&sStack_668);
    local_820 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_818 = "";
    local_830 = &boost::unit_test::basic_cstring<char_const>::null;
    local_828 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x61;
    file_00.m_begin = (iterator)&local_820;
    msg_00.m_end = pvVar20;
    msg_00.m_begin = pvVar17;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_830,
               msg_00);
    _cVar34 = 0x7f78f2;
    puVar14 = std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (&result.last_failed_block,local_60c);
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = puVar14 == local_60c;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7e0._0_8_ = "result.last_failed_block.IsNull()";
    local_7e0.m_message.px = (element_type *)0xf64b52;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_840 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_838 = "";
    pvVar17 = (iterator)0x1;
    pvVar20 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,_cVar34,
               (size_t)&local_840,0x61);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_850 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_848 = "";
    local_860 = &boost::unit_test::basic_cstring<char_const>::null;
    local_858 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x62;
    file_01.m_begin = (iterator)&local_850;
    msg_01.m_end = pvVar20;
    msg_01.m_begin = pvVar17;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_860,
               msg_01);
    _cVar34 = 0x7f79d5;
    puVar14 = std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (&result.last_scanned_block,&result.last_scanned_height);
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (optional<int> *)puVar14 == &result.last_scanned_height
    ;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7e0._0_8_ = "result.last_scanned_block.IsNull()";
    local_7e0.m_message.px = (element_type *)0xf64b75;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_870 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_868 = "";
    pvVar17 = (iterator)0x1;
    pvVar20 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,_cVar34,
               (size_t)&local_870,0x62);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_880 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_878 = "";
    local_890 = &boost::unit_test::basic_cstring<char_const>::null;
    local_888 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar34 = 0x7f7aa0;
    file_02.m_end = (iterator)0x63;
    file_02.m_begin = (iterator)&local_880;
    msg_02.m_end = pvVar20;
    msg_02.m_begin = pvVar17;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_890,
               msg_02);
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         result.last_scanned_height.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_engaged ^ 1;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7e0._0_8_ = "!result.last_scanned_height";
    local_7e0.m_message.px = (element_type *)0xf64b91;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
    paStack_690 = &local_7e0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_8a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_898 = "";
    pvVar17 = (iterator)0x1;
    pvVar20 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,_cVar34,
               (size_t)&local_8a0,99);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_8b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    local_8a8 = "";
    local_8c0.pi_ = (sp_counted_base *)&boost::unit_test::basic_cstring<char_const>::null;
    local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x64;
    file_03.m_begin = (iterator)&local_8b0;
    msg_03.m_end = pvVar20;
    msg_03.m_begin = pvVar17;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_8c0,
               msg_03);
    bStack_670 = false;
    local_678 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
    sStack_668.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pcStack_660 = "";
    GetBalance((Balance *)&locator,&wallet,0,true);
    local_7c0 = (uint256 *)
                &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0);
    local_7e8 = (undefined1  [8])&fake_time;
    fake_time.__d.__r = (duration)((ulong)fake_time.__d.__r._4_4_ << 0x20);
    local_780.m_message.px = (element_type *)0x0;
    local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_790 = (ScanResult *)0xf64a7c;
    local_788 = "";
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0xa8;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start._1_7_ = 0x13892;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
    local_7e0._0_8_ = &PTR__lazy_ostream_013890c8;
    local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_7c8 = local_7e8;
    pvVar17 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_780,(lazy_ostream *)local_678,1,2,REQUIRE,0xf64b92,(size_t)&local_790,100,
               (assertion_result *)&locator_1,"0",&local_7e0);
    boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
    WalletRescanReserver::~WalletRescanReserver(&reserver);
    CWallet::~CWallet(&wallet);
    pCVar3 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chain._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    result._0_8_ = result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc;
    std::__cxx11::string::_M_construct<char_const*>((string *)&result,"");
    local_6c0 = (_Base_ptr)(local_6d8 + 8);
    local_6d8 = (undefined1  [16])0x0;
    local_6c8 = (_Base_ptr)0x0;
    local_6b0 = 0;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pCVar31;
    records_00._M_t._M_impl._0_8_ = puVar30;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)this;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pCVar21;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this_00;
    records_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff420;
    local_6b8 = local_6c0;
    CreateMockableWalletDatabase((wallet *)&local_8c8,records_00);
    CWallet::CWallet(&wallet,pCVar3,(string *)&result,
                     (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                      )&local_8c8);
    if (local_8c8 != (element_type *)0x0) {
      (*(local_8c8->m_stream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        [1])();
    }
    local_8c8 = (element_type *)0x0;
    std::
    _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                 *)local_6d8);
    if ((uchar *)result._0_8_ !=
        result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc) {
      operator_delete((void *)result._0_8_,
                      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ + 1);
    }
    result._0_8_ = &wallet.cs_wallet;
    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&result);
    pcVar18 = "m_node.chainman";
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (puVar30,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
               ,0x6d,"test_method","m_node.chainman");
    reserver._0_9_ = ZEXT89(0x139c540);
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&reserver);
    CWallet::SetWalletFlag(&wallet,0x400000000);
    pCVar12 = ChainstateManager::ActiveChainstate
                        ((puVar30->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar2 = (pCVar12->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppCVar4 = (pCVar12->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar12 = ChainstateManager::ActiveChainstate
                        ((puVar30->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar5 = (pCVar12->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar5 != (uint256 *)0x0) {
      wallet.m_last_block_processed_height = (int)((ulong)((long)ppCVar2 - (long)ppCVar4) >> 3) + -1
      ;
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&reserver);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&result);
      AddKey(&wallet,this_00);
      reserver.m_could_reserve = false;
      reserver.m_wallet = &wallet;
      reserver.m_now.super__Function_base._M_functor = (_Any_data)0x0;
      reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
      reserver.m_now._M_invoker = (_Invoker_type)0x0;
      fake_time.__d.__r = (duration)0;
      local_8f0._8_8_ = 0;
      local_8f0._M_unused._M_object = &fake_time;
      local_8d8 = std::
                  _Function_handler<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:116:25)>
                  ::_M_invoke;
      local_8e0 = std::
                  _Function_handler<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:116:25)>
                  ::_M_manager;
      std::
      function<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_()>
      ::operator=(&reserver.m_now,
                  (function<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_()>
                   *)&local_8f0);
      if (local_8e0 != (code *)0x0) {
        (*local_8e0)(&local_8f0,&local_8f0,__destroy_functor);
      }
      WalletRescanReserver::reserve(&reserver,false);
      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = paStack_690;
      stack0xfffffffffffff968 = auVar8 << 0x40;
      local_900 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_8f8 = "";
      local_910 = &boost::unit_test::basic_cstring<char_const>::null;
      local_908 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x79;
      file_04.m_begin = (iterator)&local_900;
      msg_04.m_end = pvVar17;
      msg_04.m_begin = pcVar18;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_910,
                 msg_04);
      uVar9 = wallet.m_database;
      if ((__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
          wallet.m_database._M_t.
          super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
          ._M_t.
          super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
          .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)0x0
         ) {
LAB_007f9f76:
        __assert_fail("static_cast<bool>(m_database)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                      ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
      }
      (**(code **)(*(long *)wallet.m_database._M_t.
                            super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                            .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl +
                  0x70))(&local_7e0,
                         wallet.m_database._M_t.
                         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl,1);
      local_7e0.m_message.px =
           (element_type *)
           uVar9._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      _cVar34 = 0x7f7fd9;
      bVar10 = WalletBatch::ReadBestBlock((WalletBatch *)&local_7e0,&locator);
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = !bVar10;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_678 = (undefined1  [8])0xf64bb5;
      bStack_670 = true;
      uStack_66f = 'K';
      uStack_66e = 0xf6;
      uStack_66d = '\0';
      uStack_66c = '\0';
      uStack_66b = '\0';
      uStack_66a = '\0';
      uStack_669 = '\0';
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      result._0_8_ = &PTR__lazy_ostream_01389048;
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_920 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_918 = "";
      pvVar17 = (iterator)0x1;
      pvVar20 = (iterator)0x0;
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._20_8_ =
           (lazy_ostream *)local_678;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&locator_1,(lazy_ostream *)&result,1,0,WARN,_cVar34,
                 (size_t)&local_920,0x79);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if ((undefined **)local_7e0._0_8_ != (undefined **)0x0) {
        (**(code **)(*(undefined **)local_7e0._0_8_ + 0x28))();
      }
      local_930 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_928 = "";
      local_940 = &boost::unit_test::basic_cstring<char_const>::null;
      local_938 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar34 = 0x7f80b5;
      file_05.m_end = (iterator)0x7a;
      file_05.m_begin = (iterator)&local_930;
      msg_05.m_end = pvVar20;
      msg_05.m_begin = pvVar17;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_940,
                 msg_05);
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ =
           locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start ==
           locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_7e0._0_8_ = "locator.IsNull()";
      local_7e0.m_message.px = (element_type *)0xf64c68;
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      result._0_8_ = &PTR__lazy_ostream_01389048;
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_950 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_948 = "";
      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._20_8_ = &local_7e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&locator_1,(lazy_ostream *)&result,1,0,WARN,_cVar34,
                 (size_t)&local_950,0x7a);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pCVar32 = pCVar21;
      if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      puVar5 = pCVar21->phashBlock;
      if (puVar5 != (uint256 *)0x0) {
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._0_16_ =
             *(undefined1 (*) [16])(puVar5->super_base_blob<256U>).m_data._M_elems;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
        pWVar19 = &reserver;
        pvVar17 = (iterator)0x0;
        CWallet::ScanForWalletTransactions
                  (&result,&wallet,(uint256 *)&locator,pCVar21->nHeight,(optional<int>)0x0,pWVar19,
                   false,true);
        local_960 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_958 = "";
        local_970 = &boost::unit_test::basic_cstring<char_const>::null;
        local_968 = &boost::unit_test::basic_cstring<char_const>::null;
        file_06.m_end = (iterator)0x7e;
        file_06.m_begin = (iterator)&local_960;
        msg_06.m_end = (iterator)pWVar19;
        msg_06.m_begin = pvVar17;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_970
                   ,msg_06);
        local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
        local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
        local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_7c8 = "";
        local_678[0] = result.status == SUCCESS;
        local_7e8 = (undefined1  [8])((ulong)local_7e8 & 0xffffffff00000000);
        bStack_670 = false;
        uStack_66f = '\0';
        uStack_66e = '\0';
        uStack_66d = '\0';
        uStack_66c = '\0';
        uStack_66b = '\0';
        uStack_66a = '\0';
        uStack_669 = '\0';
        sStack_668.pi_ = (sp_counted_base *)0x0;
        local_780._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_780.m_message.px = (element_type *)0xf64ae8;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01390248;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        local_7c0 = (uint256 *)local_7e8;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 0x48;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start._1_7_ = 0x13902;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        pvVar17 = (iterator)0x1;
        pvVar20 = (iterator)0x2;
        local_790 = &result;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf64b06,
                   (size_t)&local_780,0x7e,(uint256 *)&locator,"CWallet::ScanResult::SUCCESS",
                   (assertion_result *)&locator_1);
        boost::detail::shared_count::~shared_count(&sStack_668);
        local_980 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_978 = "";
        local_990 = &boost::unit_test::basic_cstring<char_const>::null;
        local_988 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0x7f;
        file_07.m_begin = (iterator)&local_980;
        msg_07.m_end = pvVar20;
        msg_07.m_begin = pvVar17;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_990
                   ,msg_07);
        _cVar34 = 0x7f837b;
        puVar14 = std::
                  __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                            (&result.last_failed_block,local_60c);
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = puVar14 == local_60c;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._1_7_ = 0;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_7e0._0_8_ = "result.last_failed_block.IsNull()";
        local_7e0.m_message.px = (element_type *)0xf64b52;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
        paStack_690 = &local_7e0;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        local_9a0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_998 = "";
        pvVar17 = (iterator)0x1;
        pvVar20 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,_cVar34,
                   (size_t)&local_9a0,0x7f);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        local_9b0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
        ;
        local_9a8 = "";
        local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_08.m_end = (iterator)0x80;
        file_08.m_begin = (iterator)&local_9b0;
        msg_08.m_end = pvVar20;
        msg_08.m_begin = pvVar17;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_9c0
                   ,msg_08);
        local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
        local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
        local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_7c8 = "";
        puVar5 = pCVar31->phashBlock;
        if (puVar5 != (uint256 *)0x0) {
          local_678 = *(undefined1 (*) [8])(puVar5->super_base_blob<256U>).m_data._M_elems;
          bStack_670 = (bool)(puVar5->super_base_blob<256U>).m_data._M_elems[8];
          uStack_66f = (puVar5->super_base_blob<256U>).m_data._M_elems[9];
          uStack_66e = (puVar5->super_base_blob<256U>).m_data._M_elems[10];
          uStack_66d = (puVar5->super_base_blob<256U>).m_data._M_elems[0xb];
          uStack_66c = (puVar5->super_base_blob<256U>).m_data._M_elems[0xc];
          uStack_66b = (puVar5->super_base_blob<256U>).m_data._M_elems[0xd];
          uStack_66a = (puVar5->super_base_blob<256U>).m_data._M_elems[0xe];
          uStack_669 = (puVar5->super_base_blob<256U>).m_data._M_elems[0xf];
          auVar1 = *(undefined1 (*) [16])((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
          sStack_668.pi_ = auVar1._0_8_;
          pcStack_660 = auVar1._8_8_;
          auVar26[0] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x10] ==
                        auVar1[0]);
          auVar26[1] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x11] ==
                        auVar1[1]);
          auVar26[2] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x12] ==
                        auVar1[2]);
          auVar26[3] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x13] ==
                        auVar1[3]);
          auVar26[4] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x14] ==
                        auVar1[4]);
          auVar26[5] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x15] ==
                        auVar1[5]);
          auVar26[6] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x16] ==
                        auVar1[6]);
          auVar26[7] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x17] ==
                        auVar1[7]);
          auVar26[8] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x18] ==
                        auVar1[8]);
          auVar26[9] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x19] ==
                        auVar1[9]);
          auVar26[10] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                         auVar1[10]);
          auVar26[0xb] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                          auVar1[0xb]);
          auVar26[0xc] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                          auVar1[0xc]);
          auVar26[0xd] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                          auVar1[0xd]);
          auVar26[0xe] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                          auVar1[0xe]);
          auVar26[0xf] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                          auVar1[0xf]);
          auVar22[0] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0]);
          auVar22[1] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[1] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[1]);
          auVar22[2] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[2] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[2]);
          auVar22[3] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[3] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[3]);
          auVar22[4] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[4]);
          auVar22[5] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[5] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[5]);
          auVar22[6] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[6] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[6]);
          auVar22[7] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[7] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[7]);
          auVar22[8] = -((bool)result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[8] ==
                        bStack_670);
          auVar22[9] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[9] ==
                        uStack_66f);
          auVar22[10] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[10] ==
                         uStack_66e);
          auVar22[0xb] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xb] ==
                          uStack_66d);
          auVar22[0xc] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xc] ==
                          uStack_66c);
          auVar22[0xd] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xd] ==
                          uStack_66b);
          auVar22[0xe] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xe] ==
                          uStack_66a);
          auVar22[0xf] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0xf] ==
                          uStack_669);
          auVar22 = auVar22 & auVar26;
          local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
          local_780.m_message.px = (element_type *)0x0;
          local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_790 = (ScanResult *)0xf64a7c;
          local_788 = "";
          local_7c0 = &result.last_scanned_block;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389a00;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_7e8 = (undefined1  [8])local_678;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._1_7_ = 0x1389a;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          pvVar17 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_780,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf64bef,(size_t)&local_790,
                     0x80,(lazy_ostream *)&locator,"newTip->GetBlockHash()",&locator_1);
          boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
          local_9d0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_9c8 = "";
          local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_09.m_end = (iterator)0x81;
          file_09.m_begin = (iterator)&local_9d0;
          msg_09.m_end = pvVar20;
          msg_09.m_begin = pvVar17;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                     (size_t)&local_9e0,msg_09);
          local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
          local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
          local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_7c8 = "";
          local_678[0] = result.last_scanned_height.super__Optional_base<int,_true,_true>._M_payload
                         .super__Optional_payload_base<int>._M_payload._M_value == pCVar31->nHeight;
          piVar33 = &pCVar31->nHeight;
          bStack_670 = false;
          uStack_66f = '\0';
          uStack_66e = '\0';
          uStack_66d = '\0';
          uStack_66c = '\0';
          uStack_66b = '\0';
          uStack_66a = '\0';
          uStack_669 = '\0';
          sStack_668.pi_ = (sp_counted_base *)0x0;
          local_780._0_8_ =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_780.m_message.px = (element_type *)0xf64ae8;
          local_790 = (ScanResult *)&result.last_scanned_height;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013890c8;
          paStack_690 = (assertion_result *)&local_790;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 200;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._1_7_ = 0x13890;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          pvVar17 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          local_7c0 = (uint256 *)piVar33;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf64c20,
                     (size_t)&local_780,0x81,(lazy_ostream *)&locator,"newTip->nHeight",&locator_1);
          boost::detail::shared_count::~shared_count(&sStack_668);
          local_9f0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_9e8 = "";
          local_a08.m_message.px =
               (element_type *)&boost::unit_test::basic_cstring<char_const>::null;
          local_a08.m_message.pn.pi_ =
               (sp_counted_base *)&boost::unit_test::basic_cstring<char_const>::null;
          file_10.m_end = (iterator)0x82;
          file_10.m_begin = (iterator)&local_9f0;
          msg_10.m_end = pvVar20;
          msg_10.m_begin = pvVar17;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                     (size_t)&local_a08.m_message,msg_10);
          bStack_670 = false;
          local_678 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
          sStack_668.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          pcStack_660 = "";
          GetBalance((Balance *)&locator,&wallet,0,true);
          local_7e8 = (undefined1  [8])&local_a08;
          local_a08.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)0x0;
          local_a08._1_7_ = 0x2540be4;
          local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == (pointer)0x2540be400);
          local_780.m_message.px = (element_type *)0x0;
          local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_790 = (ScanResult *)0xf64a7c;
          local_788 = "";
          local_7c0 = (uint256 *)
                      &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 0xa8;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._1_7_ = 0x13892;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
          local_7e0._0_8_ = &PTR__lazy_ostream_013892a8;
          local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_7c8 = local_7e8;
          pvVar17 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_780,(lazy_ostream *)local_678,1,2,REQUIRE,0xf64b92,(size_t)&local_790,
                     0x82,&locator_1,"100 * COIN",&local_7e0);
          boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start._1_7_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._1_7_ = 0;
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a18 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_a10 = "";
          local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
          local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
          file_11.m_end = (iterator)0x86;
          file_11.m_begin = (iterator)&local_a18;
          msg_11.m_end = pvVar20;
          msg_11.m_begin = pvVar17;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                     (size_t)&local_a28,msg_11);
          if ((__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
              )wallet.m_database._M_t.
               super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
               ._M_t.
               super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
               .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
              )0x0) goto LAB_007f9f76;
          pCVar21 = pCVar32;
          (**(code **)(*(long *)wallet.m_database._M_t.
                                super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                                .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl
                      + 0x70))
                    (local_678,
                     wallet.m_database._M_t.
                     super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                     .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl,1);
          bStack_670 = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._0_1_;
          uStack_66f = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._1_1_;
          uStack_66e = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._2_1_;
          uStack_66d = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._3_1_;
          uStack_66c = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._4_1_;
          uStack_66b = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._5_1_;
          uStack_66a = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._6_1_;
          uStack_669 = wallet.m_database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl._7_1_;
          _cVar34 = 0x7f8975;
          rVar11.super_readonly_property<bool>.super_class_property<bool>.value =
               (readonly_property<bool>)
               WalletBatch::ReadBestBlock((WalletBatch *)local_678,&locator_1);
          local_7e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = rVar11.super_readonly_property<bool>.super_class_property<bool>.value;
          local_7e0.m_message.px = (element_type *)0x0;
          local_7e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_780._0_8_ = "WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator)";
          local_780.m_message.px = (element_type *)0xf64bee;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
          paStack_690 = &local_780;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_a38 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_a30 = "";
          pvVar17 = (iterator)0x1;
          pvVar20 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_7e0,(lazy_ostream *)&locator,1,0,WARN,_cVar34,(size_t)&local_a38,0x86);
          boost::detail::shared_count::~shared_count(&local_7e0.m_message.pn);
          if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
               )local_678 != (DatabaseBatch *)0x0) {
            (*(*(_func_int ***)local_678)[5])();
          }
          local_a48 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_a40 = "";
          local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
          local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
          _cVar34 = 0x7f8a5d;
          file_12.m_end = (iterator)0x87;
          file_12.m_begin = (iterator)&local_a48;
          msg_12.m_end = pvVar20;
          msg_12.m_begin = pvVar17;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                     (size_t)&local_a58,msg_12);
          local_7e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           (byte)locator_1.vHave.
                                 super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                 super__Vector_impl_data._M_start) !=
                 CONCAT71(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_finish._1_7_,
                          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_finish._0_1_));
          local_7e0.m_message.px = (element_type *)0x0;
          local_7e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_678 = (undefined1  [8])0xf64c57;
          bStack_670 = true;
          uStack_66f = 'L';
          uStack_66e = 0xf6;
          uStack_66d = '\0';
          uStack_66c = '\0';
          uStack_66b = '\0';
          uStack_66a = '\0';
          uStack_669 = '\0';
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
          paStack_690 = (assertion_result *)local_678;
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_a68 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_a60 = "";
          boost::test_tools::tt_detail::report_assertion
                    (&local_7e0,(lazy_ostream *)&locator,1,0,WARN,_cVar34,(size_t)&local_a68,0x87);
          boost::detail::shared_count::~shared_count(&local_7e0.m_message.pn);
          pvVar7 = (void *)CONCAT71(locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_start._1_7_,
                                    (byte)locator_1.vHave.
                                          super__Vector_base<uint256,_std::allocator<uint256>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
          val = puVar30;
          if (pvVar7 != (void *)0x0) {
            operator_delete(pvVar7,(long)locator_1.vHave.
                                         super__Vector_base<uint256,_std::allocator<uint256>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar7);
          }
          WalletRescanReserver::~WalletRescanReserver(&reserver);
          CWallet::~CWallet(&wallet);
          wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
          wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
          std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&wallet)
          ;
          aVar16 = -(uint)((pCVar32->nStatus & 8) == 0) | pCVar32->nFile;
          puVar15 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                              (puVar30,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                               ,0x90,"test_method","m_node.chainman");
          ::node::BlockManager::PruneOneBlockFile
                    (&((puVar15->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman,
                     aVar16);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&wallet);
          pCVar6 = (puVar30->_M_t).
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
          result.status = aVar16;
          __l._M_len = 1;
          __l._M_array = (iterator)&result;
          std::set<int,_std::less<int>,_std::allocator<int>_>::set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&wallet,__l,
                     (less<int> *)&reserver,(allocator_type *)&locator);
          ::node::BlockManager::UnlinkPrunedFiles
                    (&pCVar6->m_blockman,(set<int,_std::less<int>,_std::allocator<int>_> *)&wallet);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&wallet);
          pCVar3 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                   super_BasicTestingSetup.m_node.chain._M_t.
                   super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                   .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
          result._0_8_ = result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc;
          std::__cxx11::string::_M_construct<char_const*>((string *)&result,"","");
          local_6f0 = (_Base_ptr)(local_708 + 8);
          local_708 = (undefined1  [16])0x0;
          local_6f8 = (_Base_ptr)0x0;
          local_6e0 = 0;
          records_01._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pCVar31;
          records_01._M_t._M_impl._0_8_ = val;
          records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)this;
          records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pCVar21;
          records_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this_00;
          records_01._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)piVar33;
          local_6e8 = local_6f0;
          CreateMockableWalletDatabase((wallet *)&local_a70,records_01);
          CWallet::CWallet(&wallet,pCVar3,(string *)&result,
                           (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                            )&local_a70);
          if (local_a70 != (long *)0x0) {
            (**(code **)(*local_a70 + 8))();
          }
          local_a70 = (long *)0x0;
          std::
          _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                       *)local_708);
          if ((uchar *)result._0_8_ !=
              result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc) {
            operator_delete((void *)result._0_8_,
                            result.last_scanned_block.super_base_blob<256U>.m_data._M_elems._12_8_ +
                            1);
          }
          result._0_8_ = &wallet.cs_wallet;
          result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&result)
          ;
          inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                    (val,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                     ,0x9a,"test_method","m_node.chainman");
          reserver._0_9_ = ZEXT89(0x139c540);
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)&reserver);
          CWallet::SetWalletFlag(&wallet,0x400000000);
          pCVar12 = ChainstateManager::ActiveChainstate
                              ((val->_M_t).
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
          ppCVar2 = (pCVar12->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppCVar4 = (pCVar12->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar12 = ChainstateManager::ActiveChainstate
                              ((val->_M_t).
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
          puVar5 = (pCVar12->m_chain).vChain.
                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1]->phashBlock;
          if (puVar5 != (uint256 *)0x0) {
            wallet.m_last_block_processed_height =
                 (int)((ulong)((long)ppCVar2 - (long)ppCVar4) >> 3) + -1;
            wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
            wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
            wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
            wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&reserver);
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&result);
            AddKey(&wallet,this_00);
            reserver.m_could_reserve = false;
            reserver.m_wallet = &wallet;
            reserver.m_now.super__Function_base._M_functor = (_Any_data)0x0;
            reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
            reserver.m_now._M_invoker = (_Invoker_type)0x0;
            WalletRescanReserver::reserve(&reserver,false);
            puVar5 = pCVar32->phashBlock;
            if (puVar5 != (uint256 *)0x0) {
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._0_16_ =
                   *(undefined1 (*) [16])(puVar5->super_base_blob<256U>).m_data._M_elems;
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
              pWVar19 = &reserver;
              pvVar17 = (iterator)0x0;
              CWallet::ScanForWalletTransactions
                        (&result,&wallet,(uint256 *)&locator,pCVar32->nHeight,(optional<int>)0x0,
                         pWVar19,false,false);
              local_a80 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
              ;
              local_a78 = "";
              local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
              local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
              file_13.m_end = (iterator)0xa2;
              file_13.m_begin = (iterator)&local_a80;
              msg_13.m_end = (iterator)pWVar19;
              msg_13.m_begin = pvVar17;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                         (size_t)&local_a90,msg_13);
              local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
              local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
              local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_7c8 = "";
              local_678[0] = result.status == FAILURE;
              local_7e8._0_4_ = 1;
              bStack_670 = false;
              uStack_66f = '\0';
              uStack_66e = '\0';
              uStack_66d = '\0';
              uStack_66c = '\0';
              uStack_66b = '\0';
              uStack_66a = '\0';
              uStack_669 = '\0';
              sStack_668.pi_ = (sp_counted_base *)0x0;
              local_780._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
              ;
              local_780.m_message.px = (element_type *)0xf64ae8;
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = 0;
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01390248;
              paStack_690 = (assertion_result *)&local_790;
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)boost::unit_test::lazy_ostream::inst;
              local_7c0 = (uint256 *)local_7e8;
              locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = 0;
              locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start._0_1_ = 0x48;
              locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start._1_7_ = 0x13902;
              locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)boost::unit_test::lazy_ostream::inst;
              pvVar17 = (iterator)0x1;
              pvVar20 = (iterator)0x2;
              local_790 = &result;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,
                         0xf64b06,(size_t)&local_780,0xa2,(uint256 *)&locator,
                         "CWallet::ScanResult::FAILURE",&locator_1);
              boost::detail::shared_count::~shared_count(&sStack_668);
              local_aa0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
              ;
              local_a98 = "";
              local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
              file_14.m_end = (iterator)0xa3;
              file_14.m_begin = (iterator)&local_aa0;
              msg_14.m_end = pvVar20;
              msg_14.m_begin = pvVar17;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                         (size_t)&local_ab0,msg_14);
              local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
              local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
              local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_7c8 = "";
              puVar5 = pCVar21->phashBlock;
              if (puVar5 != (uint256 *)0x0) {
                local_678 = *(undefined1 (*) [8])(puVar5->super_base_blob<256U>).m_data._M_elems;
                bStack_670 = (bool)(puVar5->super_base_blob<256U>).m_data._M_elems[8];
                uStack_66f = (puVar5->super_base_blob<256U>).m_data._M_elems[9];
                uStack_66e = (puVar5->super_base_blob<256U>).m_data._M_elems[10];
                uStack_66d = (puVar5->super_base_blob<256U>).m_data._M_elems[0xb];
                uStack_66c = (puVar5->super_base_blob<256U>).m_data._M_elems[0xc];
                uStack_66b = (puVar5->super_base_blob<256U>).m_data._M_elems[0xd];
                uStack_66a = (puVar5->super_base_blob<256U>).m_data._M_elems[0xe];
                uStack_669 = (puVar5->super_base_blob<256U>).m_data._M_elems[0xf];
                auVar1 = *(undefined1 (*) [16])
                          ((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
                sStack_668.pi_ = auVar1._0_8_;
                pcStack_660 = auVar1._8_8_;
                auVar27[0] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x10]
                              == auVar1[0]);
                auVar27[1] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x11]
                              == auVar1[1]);
                auVar27[2] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x12]
                              == auVar1[2]);
                auVar27[3] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x13]
                              == auVar1[3]);
                auVar27[4] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x14]
                              == auVar1[4]);
                auVar27[5] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x15]
                              == auVar1[5]);
                auVar27[6] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x16]
                              == auVar1[6]);
                auVar27[7] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x17]
                              == auVar1[7]);
                auVar27[8] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x18]
                              == auVar1[8]);
                auVar27[9] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x19]
                              == auVar1[9]);
                auVar27[10] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0x1a]
                               == auVar1[10]);
                auVar27[0xb] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1b] == auVar1[0xb]);
                auVar27[0xc] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1c] == auVar1[0xc]);
                auVar27[0xd] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1d] == auVar1[0xd]);
                auVar27[0xe] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1e] == auVar1[0xe]);
                auVar27[0xf] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                 [0x1f] == auVar1[0xf]);
                auVar23[0] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0] ==
                              (puVar5->super_base_blob<256U>).m_data._M_elems[0]);
                auVar23[1] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[1] ==
                              (puVar5->super_base_blob<256U>).m_data._M_elems[1]);
                auVar23[2] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[2] ==
                              (puVar5->super_base_blob<256U>).m_data._M_elems[2]);
                auVar23[3] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[3] ==
                              (puVar5->super_base_blob<256U>).m_data._M_elems[3]);
                auVar23[4] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[4] ==
                              (puVar5->super_base_blob<256U>).m_data._M_elems[4]);
                auVar23[5] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[5] ==
                              (puVar5->super_base_blob<256U>).m_data._M_elems[5]);
                auVar23[6] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[6] ==
                              (puVar5->super_base_blob<256U>).m_data._M_elems[6]);
                auVar23[7] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[7] ==
                              (puVar5->super_base_blob<256U>).m_data._M_elems[7]);
                auVar23[8] = -((bool)result.last_failed_block.super_base_blob<256U>.m_data._M_elems
                                     [8] == bStack_670);
                auVar23[9] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[9] ==
                              uStack_66f);
                auVar23[10] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[10]
                               == uStack_66e);
                auVar23[0xb] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xb]
                                == uStack_66d);
                auVar23[0xc] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xc]
                                == uStack_66c);
                auVar23[0xd] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xd]
                                == uStack_66b);
                auVar23[0xe] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xe]
                                == uStack_66a);
                auVar23[0xf] = -(result.last_failed_block.super_base_blob<256U>.m_data._M_elems[0xf]
                                == uStack_669);
                auVar23 = auVar23 & auVar27;
                local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)
                         (readonly_property<bool>)
                         ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff);
                local_780.m_message.px = (element_type *)0x0;
                local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_790 = (ScanResult *)0xf64a7c;
                local_788 = "";
                local_7c0 = &result.last_failed_block;
                locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_ = 0;
                locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389a00;
                paStack_690 = (assertion_result *)&local_7c0;
                locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)boost::unit_test::lazy_ostream::inst;
                locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_ = 0;
                locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start._0_1_ = 0;
                locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start._1_7_ = 0x1389a;
                locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)boost::unit_test::lazy_ostream::inst;
                pvVar17 = (iterator)0x1;
                pvVar20 = (iterator)0x2;
                local_7e8 = (undefined1  [8])local_678;
                boost::test_tools::tt_detail::report_assertion
                          (&local_780,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf64c69,
                           (size_t)&local_790,0xa3,(uint256 *)&locator,"oldTip->GetBlockHash()",
                           &locator_1);
                boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                local_ac0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                ;
                local_ab8 = "";
                local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_15.m_end = (iterator)0xa4;
                file_15.m_begin = (iterator)&local_ac0;
                msg_15.m_end = pvVar20;
                msg_15.m_begin = pvVar17;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                           (size_t)&local_ad0,msg_15);
                local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
                local_7e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_7c8 = "";
                puVar5 = pCVar31->phashBlock;
                if (puVar5 != (uint256 *)0x0) {
                  local_678 = *(undefined1 (*) [8])(puVar5->super_base_blob<256U>).m_data._M_elems;
                  bStack_670 = (bool)(puVar5->super_base_blob<256U>).m_data._M_elems[8];
                  uStack_66f = (puVar5->super_base_blob<256U>).m_data._M_elems[9];
                  uStack_66e = (puVar5->super_base_blob<256U>).m_data._M_elems[10];
                  uStack_66d = (puVar5->super_base_blob<256U>).m_data._M_elems[0xb];
                  uStack_66c = (puVar5->super_base_blob<256U>).m_data._M_elems[0xc];
                  uStack_66b = (puVar5->super_base_blob<256U>).m_data._M_elems[0xd];
                  uStack_66a = (puVar5->super_base_blob<256U>).m_data._M_elems[0xe];
                  uStack_669 = (puVar5->super_base_blob<256U>).m_data._M_elems[0xf];
                  auVar1 = *(undefined1 (*) [16])
                            ((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
                  sStack_668.pi_ = auVar1._0_8_;
                  pcStack_660 = auVar1._8_8_;
                  auVar28[0] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x10] == auVar1[0]);
                  auVar28[1] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x11] == auVar1[1]);
                  auVar28[2] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x12] == auVar1[2]);
                  auVar28[3] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x13] == auVar1[3]);
                  auVar28[4] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x14] == auVar1[4]);
                  auVar28[5] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x15] == auVar1[5]);
                  auVar28[6] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x16] == auVar1[6]);
                  auVar28[7] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x17] == auVar1[7]);
                  auVar28[8] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x18] == auVar1[8]);
                  auVar28[9] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                 [0x19] == auVar1[9]);
                  auVar28[10] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                  [0x1a] == auVar1[10]);
                  auVar28[0xb] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1b] == auVar1[0xb]);
                  auVar28[0xc] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1c] == auVar1[0xc]);
                  auVar28[0xd] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1d] == auVar1[0xd]);
                  auVar28[0xe] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1e] == auVar1[0xe]);
                  auVar28[0xf] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0x1f] == auVar1[0xf]);
                  auVar24[0] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[0]
                                == (puVar5->super_base_blob<256U>).m_data._M_elems[0]);
                  auVar24[1] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[1]
                                == (puVar5->super_base_blob<256U>).m_data._M_elems[1]);
                  auVar24[2] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[2]
                                == (puVar5->super_base_blob<256U>).m_data._M_elems[2]);
                  auVar24[3] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[3]
                                == (puVar5->super_base_blob<256U>).m_data._M_elems[3]);
                  auVar24[4] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4]
                                == (puVar5->super_base_blob<256U>).m_data._M_elems[4]);
                  auVar24[5] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[5]
                                == (puVar5->super_base_blob<256U>).m_data._M_elems[5]);
                  auVar24[6] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[6]
                                == (puVar5->super_base_blob<256U>).m_data._M_elems[6]);
                  auVar24[7] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[7]
                                == (puVar5->super_base_blob<256U>).m_data._M_elems[7]);
                  auVar24[8] = -((bool)result.last_scanned_block.super_base_blob<256U>.m_data.
                                       _M_elems[8] == bStack_670);
                  auVar24[9] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[9]
                                == uStack_66f);
                  auVar24[10] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                  [10] == uStack_66e);
                  auVar24[0xb] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xb] == uStack_66d);
                  auVar24[0xc] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xc] == uStack_66c);
                  auVar24[0xd] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xd] == uStack_66b);
                  auVar24[0xe] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xe] == uStack_66a);
                  auVar24[0xf] = -(result.last_scanned_block.super_base_blob<256U>.m_data._M_elems
                                   [0xf] == uStack_669);
                  auVar24 = auVar24 & auVar28;
                  local_780.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)
                       (readonly_property<bool>)
                       ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff);
                  local_780.m_message.px = (element_type *)0x0;
                  local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_790 = (ScanResult *)0xf64a7c;
                  local_788 = "";
                  local_7c0 = &result.last_scanned_block;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389a00;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ = 0;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._1_7_ = 0x1389a;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  pvVar17 = (iterator)0x1;
                  pvVar20 = (iterator)0x2;
                  local_7e8 = (undefined1  [8])local_678;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_780,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf64bef,
                             (size_t)&local_790,0xa4,(uint256 *)&locator,"newTip->GetBlockHash()",
                             &locator_1);
                  boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                  local_ae0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ;
                  local_ad8 = "";
                  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_ae8 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_16.m_end = (iterator)0xa5;
                  file_16.m_begin = (iterator)&local_ae0;
                  msg_16.m_end = pvVar20;
                  msg_16.m_begin = pvVar17;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                             (size_t)&local_af0,msg_16);
                  local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                  local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
                  local_7e0.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_7c8 = "";
                  local_678[0] = result.last_scanned_height.super__Optional_base<int,_true,_true>.
                                 _M_payload.super__Optional_payload_base<int>._M_payload._M_value ==
                                 *piVar33;
                  bStack_670 = false;
                  uStack_66f = '\0';
                  uStack_66e = '\0';
                  uStack_66d = '\0';
                  uStack_66c = '\0';
                  uStack_66b = '\0';
                  uStack_66a = '\0';
                  uStack_669 = '\0';
                  sStack_668.pi_ = (sp_counted_base *)0x0;
                  local_780._0_8_ =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ;
                  local_780.m_message.px = (element_type *)0xf64ae8;
                  local_790 = (ScanResult *)&result.last_scanned_height;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013890c8;
                  paStack_690 = (assertion_result *)&local_790;
                  locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ = 200;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._1_7_ = 0x13890;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  pvVar17 = (iterator)0x1;
                  pvVar20 = (iterator)0x2;
                  local_7c0 = (uint256 *)piVar33;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,REQUIRE,
                             0xf64c20,(size_t)&local_780,0xa5,(uint256 *)&locator,"newTip->nHeight",
                             &locator_1);
                  boost::detail::shared_count::~shared_count(&sStack_668);
                  local_b00 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ;
                  local_af8 = "";
                  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_17.m_end = (iterator)0xa6;
                  file_17.m_begin = (iterator)&local_b00;
                  msg_17.m_end = pvVar20;
                  msg_17.m_begin = pvVar17;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                             (size_t)&local_b10,msg_17);
                  bStack_670 = false;
                  local_678 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                  sStack_668.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  pcStack_660 = "";
                  GetBalance((Balance *)&locator,&wallet,0,true);
                  fake_time.__d.__r = (duration)5000000000;
                  local_780.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)
                       (readonly_property<bool>)
                       (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage == (pointer)0x12a05f200);
                  local_780.m_message.px = (element_type *)0x0;
                  local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_790 = (ScanResult *)0xf64a7c;
                  local_788 = "";
                  local_7c0 = (uint256 *)
                              &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_ = 0;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ = 0xa8;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._1_7_ = 0x13892;
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)boost::unit_test::lazy_ostream::inst;
                  local_7e8 = (undefined1  [8])&fake_time;
                  local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                  local_7e0._0_8_ = &PTR__lazy_ostream_013892a8;
                  local_7e0.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_7c8 = local_7e8;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_780,(lazy_ostream *)local_678,1,2,REQUIRE,0xf64b92,
                             (size_t)&local_790,0xa6,&locator_1,"50 * COIN",&local_7e0);
                  puVar30 = val;
                  boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                  WalletRescanReserver::~WalletRescanReserver(&reserver);
                  CWallet::~CWallet(&wallet);
                  wallet.super_WalletStorage._vptr_WalletStorage = (_func_int **)&cs_main;
                  wallet.super_Notifications._vptr_Notifications._0_1_ = 0;
                  std::unique_lock<std::recursive_mutex>::lock
                            ((unique_lock<std::recursive_mutex> *)&wallet);
                  aVar16 = -(uint)((pCVar31->nStatus & 8) == 0) | pCVar31->nFile;
                  puVar15 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                                      (val,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                                       ,0xad,"test_method","m_node.chainman");
                  ::node::BlockManager::PruneOneBlockFile
                            (&((puVar15->_M_t).
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                              m_blockman,aVar16);
                  std::unique_lock<std::recursive_mutex>::~unique_lock
                            ((unique_lock<std::recursive_mutex> *)&wallet);
                  pCVar6 = (val->_M_t).
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
                  result.status = aVar16;
                  __l_00._M_len = 1;
                  __l_00._M_array = (iterator)&result;
                  std::set<int,_std::less<int>,_std::allocator<int>_>::set
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)&wallet,__l_00,
                             (less<int> *)&reserver,(allocator_type *)&locator);
                  ::node::BlockManager::UnlinkPrunedFiles
                            (&pCVar6->m_blockman,
                             (set<int,_std::less<int>,_std::allocator<int>_> *)&wallet);
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                               *)&wallet);
                  pCVar3 = (this->super_TestChain100Setup).super_TestingSetup.
                           super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
                  result._0_8_ = result.last_scanned_block.super_base_blob<256U>.m_data._M_elems +
                                 0xc;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"");
                  local_720 = (_Base_ptr)(local_738 + 8);
                  local_738 = (undefined1  [16])0x0;
                  local_728 = (_Base_ptr)0x0;
                  local_710 = 0;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pCVar31;
                  records_02._M_t._M_impl._0_8_ = puVar30;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)this;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Base_ptr)pCVar21;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       (_Base_ptr)this_00;
                  records_02._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)piVar33;
                  local_718 = local_720;
                  CreateMockableWalletDatabase((wallet *)&local_b18,records_02);
                  CWallet::CWallet(&wallet,pCVar3,(string *)&result,
                                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                    )&local_b18);
                  if (local_b18 != (long *)0x0) {
                    (**(code **)(*local_b18 + 8))();
                  }
                  local_b18 = (long *)0x0;
                  std::
                  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                  ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                               *)local_738);
                  if ((uchar *)result._0_8_ !=
                      result.last_scanned_block.super_base_blob<256U>.m_data._M_elems + 0xc) {
                    operator_delete((void *)result._0_8_,
                                    result.last_scanned_block.super_base_blob<256U>.m_data._M_elems.
                                    _12_8_ + 1);
                  }
                  result._0_8_ = &wallet.cs_wallet;
                  result.last_scanned_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
                  std::unique_lock<std::recursive_mutex>::lock
                            ((unique_lock<std::recursive_mutex> *)&result);
                  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                            (val,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                             ,0xb6,"test_method","m_node.chainman");
                  reserver._0_9_ = ZEXT89(0x139c540);
                  std::unique_lock<std::recursive_mutex>::lock
                            ((unique_lock<std::recursive_mutex> *)&reserver);
                  CWallet::SetWalletFlag(&wallet,0x400000000);
                  pCVar12 = ChainstateManager::ActiveChainstate
                                      ((val->_M_t).
                                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                       .super__Head_base<0UL,_ChainstateManager_*,_false>.
                                       _M_head_impl);
                  ppCVar2 = (pCVar12->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  ppCVar4 = (pCVar12->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pCVar12 = ChainstateManager::ActiveChainstate
                                      ((val->_M_t).
                                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                       .super__Head_base<0UL,_ChainstateManager_*,_false>.
                                       _M_head_impl);
                  puVar5 = (pCVar12->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish[-1]->phashBlock;
                  if (puVar5 != (uint256 *)0x0) {
                    wallet.m_last_block_processed_height =
                         (int)((ulong)((long)ppCVar2 - (long)ppCVar4) >> 3) + -1;
                    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._0_8_ =
                         *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
                    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._8_8_ =
                         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
                    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._16_8_ =
                         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
                    wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._24_8_ =
                         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
                    std::unique_lock<std::recursive_mutex>::~unique_lock
                              ((unique_lock<std::recursive_mutex> *)&reserver);
                    std::unique_lock<std::recursive_mutex>::~unique_lock
                              ((unique_lock<std::recursive_mutex> *)&result);
                    AddKey(&wallet,this_00);
                    reserver.m_could_reserve = false;
                    reserver.m_wallet = &wallet;
                    reserver.m_now.super__Function_base._M_functor = (_Any_data)0x0;
                    reserver.m_now.super__Function_base._M_manager = (_Manager_type)0x0;
                    reserver.m_now._M_invoker = (_Invoker_type)0x0;
                    WalletRescanReserver::reserve(&reserver,false);
                    puVar5 = pCVar21->phashBlock;
                    if (puVar5 != (uint256 *)0x0) {
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._0_16_ =
                           *(undefined1 (*) [16])(puVar5->super_base_blob<256U>).m_data._M_elems;
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           *(pointer *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
                      pWVar19 = &reserver;
                      pvVar17 = (iterator)0x0;
                      CWallet::ScanForWalletTransactions
                                (&result,&wallet,(uint256 *)&locator,pCVar21->nHeight,
                                 (optional<int>)0x0,pWVar19,false,false);
                      local_b28 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                      ;
                      local_b20 = "";
                      local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
                      file_18.m_end = (iterator)0xbe;
                      file_18.m_begin = (iterator)&local_b28;
                      msg_18.m_end = (iterator)pWVar19;
                      msg_18.m_begin = pvVar17;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                                 (size_t)&local_b38,msg_18);
                      local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                      local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
                      local_7e0.m_message.pn.pi_ =
                           (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      local_7c8 = "";
                      local_678[0] = result.status == FAILURE;
                      local_7e8._0_4_ = 1;
                      bStack_670 = false;
                      uStack_66f = '\0';
                      uStack_66e = '\0';
                      uStack_66d = '\0';
                      uStack_66c = '\0';
                      uStack_66b = '\0';
                      uStack_66a = '\0';
                      uStack_669 = '\0';
                      sStack_668.pi_ = (sp_counted_base *)0x0;
                      local_780._0_8_ =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                      ;
                      local_780.m_message.px = (element_type *)0xf64ae8;
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_1_ = 0;
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01390248;
                      paStack_690 = (assertion_result *)&local_790;
                      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           (pointer)boost::unit_test::lazy_ostream::inst;
                      local_7c0 = (uint256 *)local_7e8;
                      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_1_ = 0;
                      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start._0_1_ = 0x48;
                      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start._1_7_ = 0x13902;
                      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           (pointer)boost::unit_test::lazy_ostream::inst;
                      pvVar17 = (iterator)0x1;
                      pvVar20 = (iterator)0x2;
                      local_790 = &result;
                      boost::test_tools::tt_detail::report_assertion
                                ((assertion_result *)local_678,(lazy_ostream *)&local_7e0,1,2,
                                 REQUIRE,0xf64b06,(size_t)&local_780,0xbe,(uint256 *)&locator,
                                 "CWallet::ScanResult::FAILURE",&locator_1);
                      boost::detail::shared_count::~shared_count(&sStack_668);
                      local_b48 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                      ;
                      local_b40 = "";
                      local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
                      file_19.m_end = (iterator)0xbf;
                      file_19.m_begin = (iterator)&local_b48;
                      msg_19.m_end = pvVar20;
                      msg_19.m_begin = pvVar17;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                                 (size_t)&local_b58,msg_19);
                      local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                      local_7e0._0_8_ = &PTR__lazy_ostream_01388f08;
                      local_7e0.m_message.pn.pi_ =
                           (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      local_7c8 = "";
                      puVar5 = pCVar31->phashBlock;
                      if (puVar5 != (uint256 *)0x0) {
                        local_678 = *(undefined1 (*) [8])
                                     (puVar5->super_base_blob<256U>).m_data._M_elems;
                        bStack_670 = (bool)(puVar5->super_base_blob<256U>).m_data._M_elems[8];
                        uStack_66f = (puVar5->super_base_blob<256U>).m_data._M_elems[9];
                        uStack_66e = (puVar5->super_base_blob<256U>).m_data._M_elems[10];
                        uStack_66d = (puVar5->super_base_blob<256U>).m_data._M_elems[0xb];
                        uStack_66c = (puVar5->super_base_blob<256U>).m_data._M_elems[0xc];
                        uStack_66b = (puVar5->super_base_blob<256U>).m_data._M_elems[0xd];
                        uStack_66a = (puVar5->super_base_blob<256U>).m_data._M_elems[0xe];
                        uStack_669 = (puVar5->super_base_blob<256U>).m_data._M_elems[0xf];
                        auVar1 = *(undefined1 (*) [16])
                                  ((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
                        sStack_668.pi_ = auVar1._0_8_;
                        pcStack_660 = auVar1._8_8_;
                        auVar29[0] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x10] == auVar1[0]);
                        auVar29[1] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x11] == auVar1[1]);
                        auVar29[2] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x12] == auVar1[2]);
                        auVar29[3] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x13] == auVar1[3]);
                        auVar29[4] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x14] == auVar1[4]);
                        auVar29[5] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x15] == auVar1[5]);
                        auVar29[6] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x16] == auVar1[6]);
                        auVar29[7] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x17] == auVar1[7]);
                        auVar29[8] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x18] == auVar1[8]);
                        auVar29[9] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0x19] == auVar1[9]);
                        auVar29[10] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                        _M_elems[0x1a] == auVar1[10]);
                        auVar29[0xb] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1b] == auVar1[0xb]);
                        auVar29[0xc] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1c] == auVar1[0xc]);
                        auVar29[0xd] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1d] == auVar1[0xd]);
                        auVar29[0xe] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1e] == auVar1[0xe]);
                        auVar29[0xf] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0x1f] == auVar1[0xf]);
                        auVar25[0] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[0] ==
                                      (puVar5->super_base_blob<256U>).m_data._M_elems[0]);
                        auVar25[1] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[1] ==
                                      (puVar5->super_base_blob<256U>).m_data._M_elems[1]);
                        auVar25[2] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[2] ==
                                      (puVar5->super_base_blob<256U>).m_data._M_elems[2]);
                        auVar25[3] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[3] ==
                                      (puVar5->super_base_blob<256U>).m_data._M_elems[3]);
                        auVar25[4] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[4] ==
                                      (puVar5->super_base_blob<256U>).m_data._M_elems[4]);
                        auVar25[5] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[5] ==
                                      (puVar5->super_base_blob<256U>).m_data._M_elems[5]);
                        auVar25[6] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[6] ==
                                      (puVar5->super_base_blob<256U>).m_data._M_elems[6]);
                        auVar25[7] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[7] ==
                                      (puVar5->super_base_blob<256U>).m_data._M_elems[7]);
                        auVar25[8] = -((bool)result.last_failed_block.super_base_blob<256U>.m_data.
                                             _M_elems[8] == bStack_670);
                        auVar25[9] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                       _M_elems[9] == uStack_66f);
                        auVar25[10] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                        _M_elems[10] == uStack_66e);
                        auVar25[0xb] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xb] == uStack_66d);
                        auVar25[0xc] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xc] == uStack_66c);
                        auVar25[0xd] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xd] == uStack_66b);
                        auVar25[0xe] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xe] == uStack_66a);
                        auVar25[0xf] = -(result.last_failed_block.super_base_blob<256U>.m_data.
                                         _M_elems[0xf] == uStack_669);
                        auVar25 = auVar25 & auVar29;
                        local_780.m_message.px = (element_type *)0x0;
                        local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_790 = (ScanResult *)0xf64a7c;
                        local_788 = "";
                        local_7c0 = &result.last_failed_block;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389a00;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_7_ = 0x1389a;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        pvVar17 = (iterator)0x1;
                        pvVar20 = (iterator)0x2;
                        local_7e8 = (undefined1  [8])local_678;
                        local_780.p_predicate_value.super_readonly_property<bool>.
                        super_class_property<bool>.value =
                             (readonly_property<bool>)
                             (readonly_property<bool>)
                             ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff);
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_780,(lazy_ostream *)&local_7e0,1,2,REQUIRE,0xf64c69,
                                   (size_t)&local_790,0xbf,(uint256 *)&locator,
                                   "newTip->GetBlockHash()",&locator_1);
                        boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                        local_b68 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_b60 = "";
                        local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_20.m_end = (iterator)0xc0;
                        file_20.m_begin = (iterator)&local_b68;
                        msg_20.m_end = pvVar20;
                        msg_20.m_begin = pvVar17;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                                   (size_t)&local_b78,msg_20);
                        _cVar34 = 0x7f9c36;
                        puVar14 = std::
                                  __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                            (&result.last_scanned_block,&result.last_scanned_height)
                        ;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_ =
                             (optional<int> *)puVar14 == &result.last_scanned_height;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_7e0._0_8_ = "result.last_scanned_block.IsNull()";
                        local_7e0.m_message.px = (element_type *)0xf64b75;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        local_b88 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_b80 = "";
                        pvVar17 = (iterator)0x1;
                        pvVar20 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,
                                   _cVar34,(size_t)&local_b88,0xc0);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)
                                   &locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
                        local_b98 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_b90 = "";
                        local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
                        _cVar34 = 0x7f9d02;
                        file_21.m_end = (iterator)0xc1;
                        file_21.m_begin = (iterator)&local_b98;
                        msg_21.m_end = pvVar20;
                        msg_21.m_begin = pvVar17;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                                   (size_t)&local_ba8,msg_21);
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_ =
                             result.last_scanned_height.super__Optional_base<int,_true,_true>.
                             _M_payload.super__Optional_payload_base<int>._M_engaged ^ 1;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_7e0._0_8_ = "!result.last_scanned_height";
                        local_7e0.m_message.px = (element_type *)0xf64b91;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
                        paStack_690 = &local_7e0;
                        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        local_bb8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_bb0 = "";
                        pvVar17 = (iterator)0x1;
                        pvVar20 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&locator_1,(lazy_ostream *)&locator,1,0,WARN,
                                   _cVar34,(size_t)&local_bb8,0xc1);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)
                                   &locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
                        local_bc8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                        ;
                        local_bc0 = "";
                        local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_22.m_end = (iterator)0xc2;
                        file_22.m_begin = (iterator)&local_bc8;
                        msg_22.m_end = pvVar20;
                        msg_22.m_begin = pvVar17;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                                   (size_t)&local_bd8,msg_22);
                        bStack_670 = false;
                        local_678 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
                        sStack_668.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                        pcStack_660 = "";
                        GetBalance((Balance *)&locator,&wallet,0,true);
                        fake_time.__d.__r =
                             (duration)((ulong)fake_time.__d.__r & 0xffffffff00000000);
                        local_780.p_predicate_value.super_readonly_property<bool>.
                        super_class_property<bool>.value =
                             (readonly_property<bool>)
                             (readonly_property<bool>)
                             (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0);
                        local_780.m_message.px = (element_type *)0x0;
                        local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_790 = (ScanResult *)0xf64a7c;
                        local_788 = "";
                        local_7c0 = (uint256 *)
                                    &locator.vHave.
                                     super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_ = 0xa8;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_7_ = 0x13892;
                        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)boost::unit_test::lazy_ostream::inst;
                        local_7e8 = (undefined1  [8])&fake_time;
                        local_7e0.m_message.px = (element_type *)(local_7e0.m_message._1_8_ << 8);
                        local_7e0._0_8_ = &PTR__lazy_ostream_013890c8;
                        local_7e0.m_message.pn.pi_ =
                             (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                        local_7c8 = local_7e8;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_780,(lazy_ostream *)local_678,1,2,REQUIRE,0xf64b92,
                                   (size_t)&local_790,0xc2,(assertion_result *)&locator_1,"0",
                                   &local_7e0);
                        boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
                        WalletRescanReserver::~WalletRescanReserver(&reserver);
                        CWallet::~CWallet(&wallet);
                        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
                          __stack_chk_fail();
                        }
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(scan_for_wallet_transactions, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    CBlockIndex* oldTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());
    WITH_LOCK(::cs_main, m_node.chainman->m_blockman.GetBlockFileInfo(oldTip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    CBlockIndex* newTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());

    // Verify ScanForWalletTransactions fails to read an unknown start block.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/{}, /*start_height=*/0, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK(result.last_failed_block.IsNull());
        BOOST_CHECK(result.last_scanned_block.IsNull());
        BOOST_CHECK(!result.last_scanned_height);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 0);
    }

    // Verify ScanForWalletTransactions picks up transactions in both the old
    // and new block files.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        std::chrono::steady_clock::time_point fake_time;
        reserver.setNow([&] { fake_time += 60s; return fake_time; });
        reserver.reserve();

        {
            CBlockLocator locator;
            BOOST_CHECK(!WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator));
            BOOST_CHECK(locator.IsNull());
        }

        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/true);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::SUCCESS);
        BOOST_CHECK(result.last_failed_block.IsNull());
        BOOST_CHECK_EQUAL(result.last_scanned_block, newTip->GetBlockHash());
        BOOST_CHECK_EQUAL(*result.last_scanned_height, newTip->nHeight);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 100 * COIN);

        {
            CBlockLocator locator;
            BOOST_CHECK(WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator));
            BOOST_CHECK(!locator.IsNull());
        }
    }

    // Prune the older block file.
    int file_number;
    {
        LOCK(cs_main);
        file_number = oldTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify ScanForWalletTransactions only picks transactions in the new block
    // file.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK_EQUAL(result.last_failed_block, oldTip->GetBlockHash());
        BOOST_CHECK_EQUAL(result.last_scanned_block, newTip->GetBlockHash());
        BOOST_CHECK_EQUAL(*result.last_scanned_height, newTip->nHeight);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 50 * COIN);
    }

    // Prune the remaining block file.
    {
        LOCK(cs_main);
        file_number = newTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify ScanForWalletTransactions scans no blocks.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK_EQUAL(result.last_failed_block, newTip->GetBlockHash());
        BOOST_CHECK(result.last_scanned_block.IsNull());
        BOOST_CHECK(!result.last_scanned_height);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 0);
    }
}